

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O1

void __thiscall
cs::compiler_type::build_expr
          (compiler_type *this,deque<char,_std::allocator<char>_> *buff,
          tree_type<cs::token_base_*> *tree,charset encoding)

{
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  _Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_78;
  
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::_M_initialize_map
            (&local_78,0);
  process_char_buff(this,buff,
                    (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_78,encoding
                   );
  process_brackets(this,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_78);
  kill_brackets(this,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_78,1);
  gen_tree(this,tree,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)&local_78);
  std::_Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~_Deque_base(&local_78);
  return;
}

Assistant:

void build_expr(const std::deque<char> &buff, tree_type<token_base *> &tree, charset encoding = charset::utf8)
		{
			std::deque<token_base *> tokens;
			process_char_buff(buff, tokens, encoding);
			process_brackets(tokens);
			kill_brackets(tokens);
			gen_tree(tree, tokens);
		}